

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringAlgorithm.cpp
# Opt level: O1

string * CppWebSpider::strip(string *__return_storage_ptr__,string *target,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar2 = s->_M_string_length;
  uVar8 = target->_M_string_length;
  if (uVar8 < uVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (target->_M_dataplus)._M_p;
    paVar1 = &target->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar4 = *(undefined8 *)((long)&target->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = uVar8;
    (target->_M_dataplus)._M_p = (pointer)paVar1;
    target->_M_string_length = 0;
    (target->field_2)._M_local_buf[0] = '\0';
  }
  else {
    uVar9 = 0;
    while (uVar6 = uVar9, uVar6 < uVar8) {
      uVar9 = uVar6;
      if (uVar2 != 0) {
        pcVar5 = (s->_M_dataplus)._M_p;
        uVar7 = uVar6;
        uVar10 = uVar2;
        do {
          uVar9 = uVar7;
          if (*pcVar5 != (target->_M_dataplus)._M_p[uVar7]) break;
          uVar7 = uVar7 + 1;
          pcVar5 = pcVar5 + 1;
          uVar10 = uVar10 - 1;
          uVar9 = uVar2 + uVar6;
        } while (uVar10 != 0);
      }
      if ((uVar9 == uVar6) || (uVar9 % uVar2 != 0)) break;
    }
    do {
      uVar9 = uVar8 - uVar2;
      if (uVar9 <= uVar6) break;
      uVar7 = uVar9;
      if (uVar2 != 0) {
        pcVar5 = (s->_M_dataplus)._M_p;
        uVar10 = uVar2;
        do {
          if (*pcVar5 != (target->_M_dataplus)._M_p[uVar7]) break;
          uVar7 = uVar7 + 1;
          pcVar5 = pcVar5 + 1;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      bVar11 = uVar7 == uVar8;
      uVar8 = uVar9;
    } while (bVar11);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)target);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string strip(std::string target,std::string s){
		size_t n=s.size(),m=target.size();
		if(m<n)
			return target;
		size_t start=0,i=0;
		while(i<m){
			for(size_t j=0;j<n;j++){
				if(s[j]!=target[i])
					break;
				i++;
			}
			if(i==start)
				break;
			if(i%n==0)
				start=i;
			else
				break;
		}
		size_t end=m;
		i=end-n;
		while(i>start){
			for(size_t j=0;j<n;j++){
				if(s[j]!=target[i])
					break;
				i++;
			}
			if(i==end)
				end-=n;
			else
				break;
			i=end-n;
		}
		std::string ans=target.substr(start,end-start);
		return ans;
	}